

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lock.c
# Opt level: O0

int pick_lock(obj *pick,int rx,int ry,boolean explicit,boolean loot_after)

{
  boolean bVar1;
  char cVar2;
  byte bVar3;
  schar sVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  char *pcVar8;
  char *pcVar9;
  rm *prVar10;
  bool bVar11;
  char *local_148;
  monst *local_120;
  monst *mtmp;
  int count;
  boolean it;
  char *verb;
  char *action;
  char *what;
  char local_c8 [5];
  schar dz;
  schar dy;
  schar dx;
  char qbuf [128];
  obj *otmp;
  rm *door;
  int local_30;
  int iStack_2c;
  coord cc;
  int ch;
  int c;
  int picktyp;
  boolean loot_after_local;
  boolean explicit_local;
  int ry_local;
  int rx_local;
  obj *pick_local;
  
  what._5_1_ = '\0';
  uVar5 = (uint)pick->otyp;
  if ((xlock.usedtime != 0) && (uVar5 == xlock.picktyp)) {
    if (((youmonst.data)->mflags1 & 0x2000) != 0) {
      action = "key";
      if (uVar5 == 0xe3) {
        action = "pick";
      }
      if (uVar5 == 0xe4) {
        action = "card";
      }
      if (uVar5 == 0xf2) {
        action = "stethoscope";
      }
      pline("Unfortunately, you can no longer %s %s.","hold the",action);
      reset_pick();
      return 0;
    }
    if ((xlock.box != (obj *)0x0) && (bVar1 = can_reach_floor(), bVar1 == '\0')) {
      pline("Unfortunately, you can no longer %s %s.","reach the","lock");
      reset_pick();
      return 0;
    }
    pcVar8 = lock_action();
    pline("You resume your attempt at %s.",pcVar8);
    set_occupation(picklock,pcVar8,0);
    return 1;
  }
  if (((youmonst.data)->mflags1 & 0x2000) != 0) {
    pcVar8 = doname(pick);
    pline("You can\'t hold %s -- you have no hands!",pcVar8);
    return 0;
  }
  if ((((uVar5 != 0xe3) && (uVar5 != 0xf2)) && (uVar5 != 0xe4)) && (uVar5 != 0xe2)) {
    warning("picking lock with object %d?",(ulong)uVar5);
    return 0;
  }
  local_30 = 0;
  if ((rx == 0) || (ry == 0)) {
    iVar6 = get_adjacent_loc((char *)0x0,"Invalid location!",u.ux,u.uy,(coord *)((long)&door + 6),
                             (schar *)((long)&what + 5));
    if (iVar6 == 0) {
      return 0;
    }
  }
  else {
    door._6_1_ = (char)rx;
    door._7_1_ = (char)ry;
  }
  what._7_1_ = door._6_1_ - u.ux;
  what._6_1_ = door._7_1_ - u.uy;
  if (((door._6_1_ == u.ux) && (door._7_1_ == u.uy)) || (uVar5 == 0xf2)) {
    if (what._5_1_ < '\0') {
      bVar11 = true;
      if ((u.uprops[0x12].intrinsic == 0) && (bVar11 = true, u.uprops[0x12].extrinsic == 0)) {
        bVar11 = (youmonst.data)->mlet == '\x05';
      }
      pcVar8 = "there";
      if (bVar11) {
        pcVar8 = "here";
      }
      pline("There isn\'t any sort of lock up %s.",pcVar8);
      return 0;
    }
    bVar1 = is_lava(level,(int)u.ux,(int)u.uy);
    if (bVar1 != '\0') {
      pcVar8 = xname(pick);
      pline("Doing that would probably melt your %s.",pcVar8);
      return 0;
    }
    bVar1 = is_pool(level,(int)u.ux,(int)u.uy);
    if ((bVar1 != '\0') && (((byte)u._1052_1_ >> 1 & 1) == 0)) {
      pline("The water has no lock.");
      return 0;
    }
    mtmp._0_4_ = 0;
    iStack_2c = 0x6e;
    for (qbuf._120_8_ = level->objects[door._6_1_][door._7_1_]; qbuf._120_8_ != 0;
        qbuf._120_8_ = *(undefined8 *)(qbuf._120_8_ + 8)) {
      if (((*(short *)(qbuf._120_8_ + 0x2a) == 0xda) || (*(short *)(qbuf._120_8_ + 0x2a) == 0xdb))
         || (*(short *)(qbuf._120_8_ + 0x2a) == 0xdc)) {
        mtmp._0_4_ = (int)mtmp + 1;
        bVar1 = can_reach_floor();
        if (bVar1 == '\0') {
          pcVar8 = xname((obj *)qbuf._120_8_);
          pcVar8 = the(pcVar8);
          pline("You can\'t reach %s from up here.",pcVar8);
          return 0;
        }
        mtmp._7_1_ = false;
        if ((*(uint *)(qbuf._120_8_ + 0x4a) >> 0xe & 1) == 0) {
          if (*(short *)(qbuf._120_8_ + 0x2a) == 0xdc) {
            _count = "crack";
            mtmp._7_1_ = true;
          }
          else if ((*(uint *)(qbuf._120_8_ + 0x4a) >> 0xd & 1) == 0) {
            _count = "lock";
            mtmp._7_1_ = true;
          }
          else {
            if (uVar5 == 0xe3) {
              _count = "pick";
            }
            else {
              _count = "unlock";
            }
            mtmp._7_1_ = uVar5 != 0xe3;
          }
        }
        else {
          _count = "fix";
        }
        pcVar8 = doname((obj *)qbuf._120_8_);
        pcVar9 = simple_typename((int)*(short *)(qbuf._120_8_ + 0x2a));
        pcVar9 = an(pcVar9);
        pcVar8 = safe_qbuf("",0x21,pcVar8,pcVar9,"a box");
        pcVar9 = "its lock";
        if (mtmp._7_1_) {
          pcVar9 = "it";
        }
        sprintf(local_c8,"There is %s here, %s %s?",pcVar8,_count,pcVar9);
        cVar2 = yn_function(local_c8,"ynq",'q');
        iStack_2c = (int)cVar2;
        if (iStack_2c == 0x71) {
          return 0;
        }
        if (iStack_2c != 0x6e) {
          if ((*(short *)(qbuf._120_8_ + 0x2a) == 0xdc) && (uVar5 != 0xf2)) {
            pline("You aren\'t sure how to go about opening the safe that way.");
            return 0;
          }
          if (((*(uint *)(qbuf._120_8_ + 0x4a) >> 0xd & 1) == 0) &&
             (*(short *)(qbuf._120_8_ + 0x2a) == 0xdc)) {
            pline("You can\'t change the combination.");
            return 0;
          }
          if ((*(uint *)(qbuf._120_8_ + 0x4a) >> 0xe & 1) != 0) {
            pcVar8 = doname(pick);
            pline("You can\'t fix its broken lock with %s.",pcVar8);
            return 0;
          }
          if ((uVar5 == 0xe4) && ((*(uint *)(qbuf._120_8_ + 0x4a) >> 0xd & 1) == 0)) {
            pcVar8 = doname(pick);
            pline("You can\'t do that with %s.",pcVar8);
            return 0;
          }
          switch(uVar5) {
          case 0xe2:
            sVar4 = acurr(3);
            local_30 = sVar4 + 0x4b;
            break;
          case 0xe3:
            sVar4 = acurr(3);
            local_30 = sVar4 * 4 + (uint)(urole.malenum == 0x164) * 0x19;
            break;
          case 0xe4:
            sVar4 = acurr(3);
            local_30 = (int)sVar4 + (uint)(urole.malenum == 0x164) * 0x14;
            break;
          default:
            local_30 = 0;
            break;
          case 0xf2:
            sVar4 = acurr(3);
            local_30 = sVar4 * 2 * (uint)(urole.malenum == 0x164) + 5;
          }
          if ((*(uint *)(qbuf._120_8_ + 0x4a) & 1) != 0) {
            local_30 = local_30 / 2;
          }
          xlock.box = (obj *)qbuf._120_8_;
          xlock.door = (rm *)0x0;
          xlock.picktyp = uVar5;
          xlock.loot_unlocked = loot_after;
          break;
        }
      }
    }
    if (iStack_2c != 0x79) {
      if ((int)mtmp == 0) {
        pline("There doesn\'t seem to be any sort of pickable lock here.");
      }
      return 0;
    }
    goto LAB_001feeee;
  }
  if ((u.utrap != 0) && (u.utraptype == 1)) {
    pline("You can\'t reach over the edge of the pit.");
    return 0;
  }
  prVar10 = level->locations[door._6_1_] + door._7_1_;
  if ((level->monsters[door._6_1_][door._7_1_] == (monst *)0x0) ||
     ((*(uint *)&level->monsters[door._6_1_][door._7_1_]->field_0x60 >> 9 & 1) != 0)) {
    local_120 = (monst *)0x0;
  }
  else {
    local_120 = level->monsters[door._6_1_][door._7_1_];
  }
  if (local_120 != (monst *)0x0) {
    if (local_120->wormno == '\0') {
      if ((viz_array[local_120->my][local_120->mx] & 2U) == 0) {
        if ((((u.uprops[0x1e].intrinsic != 0) ||
             (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
              (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
            ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) ||
           (((u.uprops[0x40].intrinsic == 0 &&
             ((u.uprops[0x40].extrinsic == 0 && (((youmonst.data)->mflags3 & 0x100) == 0)))) ||
            ((local_120->data->mflags3 & 0x200) == 0)))) goto LAB_001fea36;
        bVar3 = viz_array[local_120->my][local_120->mx] & 1;
        goto joined_r0x001fe8f8;
      }
    }
    else {
      bVar3 = worm_known(level,local_120);
joined_r0x001fe8f8:
      if (bVar3 == 0) goto LAB_001fea36;
    }
    if (((((((*(uint *)&local_120->field_0x60 >> 1 & 1) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
          (u.uprops[0xc].extrinsic != 0)) || (((youmonst.data)->mflags1 & 0x1000000) != 0)) &&
        (((*(uint *)&local_120->field_0x60 >> 7 & 1) == 0 &&
         ((*(uint *)&local_120->field_0x60 >> 9 & 1) == 0)))) &&
       ((((byte)u._1052_1_ >> 5 & 1) == 0 &&
        ((local_120->m_ap_type != '\x01' && (local_120->m_ap_type != '\x02')))))) {
      if ((uVar5 == 0xe4) &&
         (((*(uint *)&local_120->field_0x60 >> 0x19 & 1) != 0 || (local_120->data == mons + 0x11e)))
         ) {
        verbalize("No checks, no credit, no problem.");
      }
      else {
        pcVar8 = mon_nam(local_120);
        pline("I don\'t think %s would appreciate that.",pcVar8);
      }
      return 0;
    }
  }
LAB_001fea36:
  if (prVar10->typ != '\x17') {
    iVar6 = is_drawbridge_wall((int)door._6_1_,(int)door._7_1_);
    if (iVar6 < 0) {
      if ((u.uprops[0x1e].intrinsic != 0) ||
         (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
          (bVar11 = false, ((youmonst.data)->mflags1 & 0x1000) != 0)))) {
        bVar11 = false;
        if (ublindf != (obj *)0x0) {
          bVar11 = ublindf->oartifact == '\x1d';
        }
        bVar11 = (bool)(bVar11 ^ 1);
      }
      pcVar8 = "not see";
      if (bVar11) {
        pcVar8 = "You feel";
      }
      pline("You %s no door there.",pcVar8 + 4);
    }
    else {
      if (((u.uprops[0x1e].intrinsic != 0) || ((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed))))
         || (bVar11 = false, ((youmonst.data)->mflags1 & 0x1000) != 0)) {
        bVar11 = false;
        if (ublindf != (obj *)0x0) {
          bVar11 = ublindf->oartifact == '\x1d';
        }
        bVar11 = (bool)(bVar11 ^ 1);
      }
      pcVar8 = "not see";
      if (bVar11) {
        pcVar8 = "You feel";
      }
      pline("You %s no lock on the drawbridge.",pcVar8 + 4);
    }
    return 0;
  }
  uVar7 = *(uint *)&prVar10->field_0x6 >> 4 & 0x1f;
  if (uVar7 == 0) {
    pline("This doorway has no door.");
    return 0;
  }
  if (uVar7 == 1) {
    pline("This door is broken.");
    return 0;
  }
  if (uVar7 == 2) {
    pline("You cannot lock an open door.");
    return 0;
  }
  if ((uVar5 == 0xe4) && ((*(uint *)&prVar10->field_0x6 >> 4 & 8) == 0)) {
    pline("You can\'t lock a door with a credit card.");
    return 0;
  }
  *(uint *)&level->locations[door._6_1_][door._7_1_].field_0x6 =
       *(uint *)&level->locations[door._6_1_][door._7_1_].field_0x6 & 0xfffffffe | 1;
  map_background(door._6_1_,door._7_1_,1);
  pcVar8 = "L";
  if ((*(uint *)&prVar10->field_0x6 >> 4 & 8) != 0) {
    pcVar8 = "Unl";
  }
  pcVar9 = "";
  if (explicit == '\0') {
    local_148 = "";
  }
  else {
    pcVar9 = " with ";
    local_148 = doname(pick);
  }
  sprintf(local_c8,"%sock it%s%s?",pcVar8,pcVar9,local_148);
  cVar2 = yn_function(local_c8,"yn",'n');
  iStack_2c = (int)cVar2;
  if (iStack_2c == 0x6e) {
    return 0;
  }
  if (uVar5 == 0xe2) {
    sVar4 = acurr(3);
    local_30 = sVar4 + 0x46;
  }
  else if (uVar5 == 0xe3) {
    sVar4 = acurr(3);
    local_30 = sVar4 * 3 + (uint)(urole.malenum == 0x164) * 0x1e;
  }
  else if (uVar5 == 0xe4) {
    sVar4 = acurr(3);
    local_30 = sVar4 * 2 + (uint)(urole.malenum == 0x164) * 0x14;
  }
  else {
    local_30 = 0;
  }
  xlock.box = (obj *)0x0;
  xlock.loot_unlocked = '\0';
  xlock.door = prVar10;
  iVar6 = artifact_door(level,(int)door._6_1_,(int)door._7_1_);
  if (iVar6 != 0) {
    if (uVar5 == 0xe2) {
      pline("Your key doesn\'t seem to fit.");
      return 0;
    }
    local_30 = -1;
  }
LAB_001feeee:
  flags.move = '\0';
  xlock.chance = local_30;
  xlock.usedtime = 0;
  picklock_dx = what._7_1_;
  picklock_dy = what._6_1_;
  xlock.picktyp = uVar5;
  pcVar8 = lock_action();
  set_occupation(picklock,pcVar8,0);
  return 1;
}

Assistant:

int pick_lock(struct obj *pick, int rx, int ry, boolean explicit, boolean loot_after)
{
	/* rx and ry are passed only from the use-stethoscope stuff */
	int picktyp, c, ch;
	coord cc;
	struct rm	*door;
	struct obj	*otmp;
	char qbuf[QBUFSZ];
	schar dx, dy, dz = 0;

	picktyp = pick->otyp;

	/* check whether we're resuming an interrupted previous attempt */
	if (xlock.usedtime && picktyp == xlock.picktyp) {
	    static const char no_longer[] = "Unfortunately, you can no longer %s %s.";

	    if (nohands(youmonst.data)) {
		const char *what = (picktyp == LOCK_PICK) ? "pick" : "key";
		if (picktyp == CREDIT_CARD) what = "card";
		if (picktyp == STETHOSCOPE) what = "stethoscope";
		pline(no_longer, "hold the", what);
		reset_pick();
		return 0;
	    } else if (xlock.box && !can_reach_floor()) {
		pline(no_longer, "reach the", "lock");
		reset_pick();
		return 0;
	    } else {
		const char *action = lock_action();
		pline("You resume your attempt at %s.", action);
		set_occupation(picklock, action, 0);
		return 1;
	    }
	}

	if (nohands(youmonst.data)) {
		pline("You can't hold %s -- you have no hands!", doname(pick));
		return 0;
	}

	if (picktyp != LOCK_PICK &&
		picktyp != STETHOSCOPE &&
		picktyp != CREDIT_CARD &&
		picktyp != SKELETON_KEY) {
		warning("picking lock with object %d?", picktyp);
		return 0;
	}
	ch = 0;		/* lint suppression */

	/* If this is a stethoscope, we know where we came from. */
	if (rx != 0 && ry != 0) {
	    cc.x = rx;
	    cc.y = ry;
	} else {
	    if (!get_adjacent_loc(NULL, "Invalid location!", u.ux, u.uy, &cc, &dz))
		return 0;
	}

	dx = cc.x - u.ux;
	dy = cc.y - u.uy;

	/* Very clumsy special case for this, but forcing the player to
	 * a)pply > just to open a safe, when a)pply . works in all other cases? */
	if ((cc.x == u.ux && cc.y == u.uy) || picktyp == STETHOSCOPE) {	/* pick lock on a container */
	    const char *verb;
	    boolean it;
	    int count;

	    if (dz < 0) {
		pline("There isn't any sort of lock up %s.",
		      Levitation ? "here" : "there");
		return 0;
	    } else if (is_lava(level, u.ux, u.uy)) {
		pline("Doing that would probably melt your %s.",
		      xname(pick));
		return 0;
	    } else if (is_pool(level, u.ux, u.uy) && !Underwater) {
		pline("The water has no lock.");
		return 0;
	    }

	    count = 0;
	    c = 'n';			/* in case there are no boxes here */
	    for (otmp = level->objects[cc.x][cc.y]; otmp; otmp = otmp->nexthere)
		if (Is_box(otmp)) {
		    ++count;
		    if (!can_reach_floor()) {
			pline("You can't reach %s from up here.", the(xname(otmp)));
			return 0;
		    }
		    it = 0;
		    if (otmp->obroken) verb = "fix";
		    else if (otmp->otyp == IRON_SAFE) verb = "crack", it = 1;
		    else if (!otmp->olocked) verb = "lock", it = 1;
		    else if (picktyp != LOCK_PICK) verb = "unlock", it = 1;
		    else verb = "pick";
		    sprintf(qbuf, "There is %s here, %s %s?",
			    safe_qbuf("", sizeof("There is  here, unlock its lock?"),
				      doname(otmp), an(simple_typename(otmp->otyp)), "a box"),
			    verb, it ? "it" : "its lock");

		    c = ynq(qbuf);
		    if (c == 'q') return 0;
		    if (c == 'n') continue;

		    if (otmp->otyp == IRON_SAFE && picktyp != STETHOSCOPE) {
			pline("You aren't sure how to go about opening the safe that way.");
			return 0;
		    }
		    if (!otmp->olocked && otmp->otyp == IRON_SAFE) {
			pline("You can't change the combination.");
			return 0;
		    }

		    if (otmp->obroken) {
			pline("You can't fix its broken lock with %s.", doname(pick));
			return 0;
		    }
		    else if (picktyp == CREDIT_CARD && !otmp->olocked) {
			/* credit cards are only good for unlocking */
			pline("You can't do that with %s.", doname(pick));
			return 0;
		    }
		    switch(picktyp) {
			case CREDIT_CARD:
			    ch = ACURR(A_DEX) + 20*Role_if (PM_ROGUE);
			    break;
			case LOCK_PICK:
			    ch = 4*ACURR(A_DEX) + 25*Role_if (PM_ROGUE);
			    break;
			case SKELETON_KEY:
			    ch = 75 + ACURR(A_DEX);
			    break;
			case STETHOSCOPE:
			    ch = 5 + 2*ACURR(A_DEX)*Role_if(PM_ROGUE);
			    break;
			default:	ch = 0;
		    }
		    if (otmp->cursed) ch /= 2;

		    xlock.picktyp = picktyp;
		    xlock.box = otmp;
		    xlock.door = 0;
		    xlock.loot_unlocked = loot_after;
		    break;
		}
	    if (c != 'y') {
		if (!count)
		    pline("There doesn't seem to be any sort of pickable lock here.");
		return 0;		/* decided against all boxes */
	    }
	} else {			/* pick the lock in a door */
	    struct monst *mtmp;

	    if (u.utrap && u.utraptype == TT_PIT) {
		pline("You can't reach over the edge of the pit.");
		return 0;
	    }

	    door = &level->locations[cc.x][cc.y];
	    if ((mtmp = m_at(level, cc.x, cc.y)) && canseemon(level, mtmp)
			&& mtmp->m_ap_type != M_AP_FURNITURE
			&& mtmp->m_ap_type != M_AP_OBJECT) {
		if (picktyp == CREDIT_CARD &&
		    (mtmp->isshk || mtmp->data == &mons[PM_ORACLE]))
		    verbalize("No checks, no credit, no problem.");
		else
		    pline("I don't think %s would appreciate that.", mon_nam(mtmp));
		return 0;
	    }
	    if (!IS_DOOR(door->typ)) {
		if (is_drawbridge_wall(cc.x,cc.y) >= 0)
		    pline("You %s no lock on the drawbridge.",
				Blind ? "feel" : "see");
		else
		    pline("You %s no door there.",
				Blind ? "feel" : "see");
		return 0;
	    }
	    switch (door->doormask) {
		case D_NODOOR:
		    pline("This doorway has no door.");
		    return 0;
		case D_ISOPEN:
		    pline("You cannot lock an open door.");
		    return 0;
		case D_BROKEN:
		    pline("This door is broken.");
		    return 0;
		default:
		    /* credit cards are only good for unlocking */
		    if (picktyp == CREDIT_CARD && !(door->doormask & D_LOCKED)) {
			pline("You can't lock a door with a credit card.");
			return 0;
		    }

		    /*
		     * At this point, the player knows that the door
		     * is a door, and whether it's locked, but not
		     * whether it's trapped; to do this, we set the
		     * mem_door_l flag and call map_background(),
		     * which will clear it if necessary (i.e. not a door
		     * after all).
		     */
		    level->locations[cc.x][cc.y].mem_door_l = 1;
		    map_background(cc.x, cc.y, TRUE);

		    sprintf(qbuf,"%sock it%s%s?",
			(door->doormask & D_LOCKED) ? "Unl" : "L",
			explicit ? " with " : "",
			explicit ? doname(pick) : "");

		    c = yn(qbuf);
		    if (c == 'n') return 0;

		    switch(picktyp) {
			case CREDIT_CARD:
			    ch = 2*ACURR(A_DEX) + 20*Role_if (PM_ROGUE);
			    break;
			case LOCK_PICK:
			    ch = 3*ACURR(A_DEX) + 30*Role_if (PM_ROGUE);
			    break;
			case SKELETON_KEY:
			    ch = 70 + ACURR(A_DEX);
			    break;
			default:    ch = 0;
		    }
		    xlock.door = door;
		    xlock.box = 0;
		    xlock.loot_unlocked = FALSE;

		    /* ALI - Artifact doors */
		    if (artifact_door(level, cc.x, cc.y)) {
			if (picktyp == SKELETON_KEY) {
			    pline("Your key doesn't seem to fit.");
			    return 0;
			} else {
			    /* -1 == 0% chance */
			    ch = -1;
			}
		    }
	    }
	}
	flags.move = 0;
	xlock.chance = ch;
	xlock.picktyp = picktyp;
	xlock.usedtime = 0;
	picklock_dx = dx;
	picklock_dy = dy;
	set_occupation(picklock, lock_action(), 0);
	return 1;
}